

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_visitor.h
# Opt level: O3

void __thiscall
google::protobuf::internal::
VisitImpl<google::protobuf::internal::VisitorImpl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/command_line_interface.cc:1274:16)>_>
::Visit<>(VisitImpl<google::protobuf::internal::VisitorImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_compiler_command_line_interface_cc:1274:16)>_>
          *this,FieldDescriptor *descriptor)

{
  ErrorPrinter *pEVar1;
  char *pcVar2;
  string *psVar3;
  undefined4 uVar4;
  long lVar5;
  undefined4 uVar6;
  Nonnull<char_*> pcVar7;
  ulong uVar8;
  ErrorCollector *pEVar9;
  size_t in_R9;
  string_view format;
  string error;
  undefined1 *local_e8;
  undefined8 local_e0;
  undefined1 local_d8;
  undefined7 uStack_d7;
  undefined1 *local_c8;
  undefined8 local_c0;
  undefined1 local_b8;
  undefined7 uStack_b7;
  long local_a8;
  Nonnull<char_*> pcStack_a0;
  char local_98 [32];
  long local_78;
  Nonnull<char_*> local_70;
  char local_68 [32];
  long local_48;
  Nonnull<char_*> pcStack_40;
  long local_38;
  Nonnull<char_*> local_30;
  
  if (descriptor->number_ - 19000U < 1000) {
    *(this->visitor).super_anon_class_16_2_e739539f.validation_error = true;
    local_e0 = 0;
    local_d8 = 0;
    local_e8 = &local_d8;
    pcVar7 = absl::lts_20250127::numbers_internal::FastIntToBuffer(19000,local_98);
    local_a8 = (long)pcVar7 - (long)local_98;
    pcStack_a0 = local_98;
    pcVar7 = absl::lts_20250127::numbers_internal::FastIntToBuffer(19999,local_68);
    local_78 = (long)pcVar7 - (long)local_68;
    local_c0 = 0;
    local_b8 = 0;
    local_48 = local_a8;
    pcStack_40 = pcStack_a0;
    format._M_str = (char *)&local_48;
    format._M_len =
         (size_t)
         "Field numbers $0 through $1 are reserved for the protocol buffer library implementation.";
    local_c8 = &local_b8;
    local_70 = local_68;
    local_38 = local_78;
    local_30 = local_68;
    absl::lts_20250127::substitute_internal::SubstituteAndAppendArray
              ((substitute_internal *)&local_c8,(Nonnull<std::string_*>)0x58,format,
               (Nullable<const_absl::string_view_*>)0x2,in_R9);
    std::__cxx11::string::operator=((string *)&local_e8,(string *)&local_c8);
    if (local_c8 != &local_b8) {
      operator_delete(local_c8,CONCAT71(uStack_b7,local_b8) + 1);
    }
    pEVar1 = (((this->visitor).super_anon_class_16_2_e739539f.error_collector)->_M_t).
             super___uniq_ptr_impl<google::protobuf::compiler::CommandLineInterface::ErrorPrinter,_std::default_delete<google::protobuf::compiler::CommandLineInterface::ErrorPrinter>_>
             ._M_t.
             super__Tuple_impl<0UL,_google::protobuf::compiler::CommandLineInterface::ErrorPrinter_*,_std::default_delete<google::protobuf::compiler::CommandLineInterface::ErrorPrinter>_>
             .
             super__Head_base<0UL,_google::protobuf::compiler::CommandLineInterface::ErrorPrinter_*,_false>
             ._M_head_impl;
    pcVar2 = (descriptor->all_names_).payload_;
    psVar3 = descriptor->file_->name_;
    uVar8 = (ulong)*(ushort *)(pcVar2 + 2);
    pEVar9 = &pEVar1->super_ErrorCollector;
    if (pEVar1 == (ErrorPrinter *)0x0) {
      pEVar9 = (ErrorCollector *)0x0;
    }
    local_a8 = local_e0;
    lVar5 = local_a8;
    pcStack_a0 = local_e8;
    pcVar7 = pcStack_a0;
    local_a8._0_4_ = (undefined4)local_e0;
    uVar4 = (undefined4)local_a8;
    pcStack_a0._0_4_ = SUB84(local_e8,0);
    uVar6 = pcStack_a0._0_4_;
    local_a8 = lVar5;
    pcStack_a0 = pcVar7;
    (*pEVar9->_vptr_ErrorCollector[2])
              (pEVar9,psVar3->_M_string_length,(psVar3->_M_dataplus)._M_p,uVar8,pcVar2 + ~uVar8,0,1,
               uVar4,uVar6);
    if (local_e8 != &local_d8) {
      operator_delete(local_e8,CONCAT71(uStack_d7,local_d8) + 1);
    }
  }
  return;
}

Assistant:

void Visit(const FieldDescriptor& descriptor, Proto&... proto) {
    visitor(descriptor, proto...);
  }